

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

string * __thiscall
glcts::AdvancedUsageSwitchPrograms::GenVSSrc_abi_cxx11_
          (string *__return_storage_ptr__,AdvancedUsageSwitchPrograms *this,int binding,int offset)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream os;
  int offset_local;
  int binding_local;
  AdvancedUsageSwitchPrograms *this_local;
  
  os._368_4_ = offset;
  os._372_4_ = binding;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,
                           "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nflat out uvec4 o_atomic_value;\nlayout(binding = "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,os._372_4_);
  poVar1 = std::operator<<(poVar1,", offset = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,os._368_4_);
  std::operator<<(poVar1,
                  ") uniform atomic_uint ac_counter_vs;\nvoid main() {\n  gl_Position = i_vertex;\n  o_atomic_value = uvec4(atomicCounterIncrement(ac_counter_vs));\n}"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GenVSSrc(int binding, int offset)
	{
		std::ostringstream os;
		os << "#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "flat out uvec4 o_atomic_value;" NL
			  "layout(binding = "
		   << binding << ", offset = " << offset
		   << ") uniform atomic_uint ac_counter_vs;" NL "void main() {" NL "  gl_Position = i_vertex;" NL
			  "  o_atomic_value = uvec4(atomicCounterIncrement(ac_counter_vs));" NL "}";
		return os.str();
	}